

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_UndeclaredFunctionCallInArgumentThrows_Test::
~SemanticAnalyserTest_UndeclaredFunctionCallInArgumentThrows_Test
          (SemanticAnalyserTest_UndeclaredFunctionCallInArgumentThrows_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_UndeclaredFunctionCallInArgumentThrows_Test
            ((SemanticAnalyserTest_UndeclaredFunctionCallInArgumentThrows_Test *)0x1e8ed8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, UndeclaredFunctionCallInArgumentThrows)
{
  std::string source = R"SRC(
  fn f(): f32 { ret 5; }

  fn main(): f32
  {
    let x: f32 = 12;
    f(test(x));
    ret 0;
  }
  )SRC";
  throwTest(source);
}